

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderHasValue(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlNodePtr pxVar2;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (reader->node != (xmlNodePtr)0x0) {
      pxVar2 = reader->node;
      if (reader->curnode != (xmlNodePtr)0x0) {
        pxVar2 = reader->curnode;
      }
      if ((pxVar2->type < XML_XINCLUDE_START) &&
         ((0x4019cU >> (pxVar2->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
        return 1;
      }
    }
  }
  return iVar1;
}

Assistant:

int
xmlTextReaderHasValue(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(0);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    switch (node->type) {
        case XML_ATTRIBUTE_NODE:
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_NAMESPACE_DECL:
	    return(1);
	default:
	    break;
    }
    return(0);
}